

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Sbl_ManStop(Sbl_Man_t *p)

{
  Sbl_Man_t *p_local;
  
  sat_solver_delete(p->pSat);
  Vec_IntFree(p->vCardVars);
  Vec_IntFree(p->vLeaves);
  Vec_IntFree(p->vAnds);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vRoots);
  Vec_IntFree(p->vRootVars);
  Hsh_VecManStop(p->pHash);
  Vec_IntFree(p->vArrs);
  Vec_IntFree(p->vReqs);
  Vec_WecFree(p->vWindow);
  Vec_IntFree(p->vPath);
  Vec_IntFree(p->vEdges);
  Vec_WrdFree(p->vCutsI1);
  Vec_WrdFree(p->vCutsI2);
  Vec_WrdFree(p->vCutsN1);
  Vec_WrdFree(p->vCutsN2);
  Vec_IntFree(p->vCutsNum);
  Vec_IntFree(p->vCutsStart);
  Vec_IntFree(p->vCutsObj);
  Vec_IntFree(p->vSolInit);
  Vec_IntFree(p->vSolCur);
  Vec_IntFree(p->vSolBest);
  Vec_WrdFree(p->vTempI1);
  Vec_WrdFree(p->vTempI2);
  Vec_WrdFree(p->vTempN1);
  Vec_WrdFree(p->vTempN2);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vAssump);
  Vec_IntFree(p->vPolar);
  if (p != (Sbl_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sbl_ManStop( Sbl_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_IntFree( p->vCardVars );
    // internal
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vRootVars );
    Hsh_VecManStop( p->pHash );
    // timing
    Vec_IntFree( p->vArrs );
    Vec_IntFree( p->vReqs );
    Vec_WecFree( p->vWindow );
    Vec_IntFree( p->vPath );
    Vec_IntFree( p->vEdges );
    // cuts
    Vec_WrdFree( p->vCutsI1 );
    Vec_WrdFree( p->vCutsI2 );
    Vec_WrdFree( p->vCutsN1 );
    Vec_WrdFree( p->vCutsN2 );
    Vec_IntFree( p->vCutsNum );
    Vec_IntFree( p->vCutsStart );
    Vec_IntFree( p->vCutsObj );
    Vec_IntFree( p->vSolInit );
    Vec_IntFree( p->vSolCur );
    Vec_IntFree( p->vSolBest );
    Vec_WrdFree( p->vTempI1 );
    Vec_WrdFree( p->vTempI2 );
    Vec_WrdFree( p->vTempN1 );
    Vec_WrdFree( p->vTempN2 );
    // temporary
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vAssump );
    Vec_IntFree( p->vPolar );
    // other
    ABC_FREE( p );
}